

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_serializer_boost_po::serialize<float>
          (options_serializer_boost_po *this,typed_option<float> *typed_option)

{
  float *pfVar1;
  ostream *poVar2;
  double dVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18," --",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,
                      (typed_option->super_base_option).m_name._M_dataplus._M_p,
                      (typed_option->super_base_option).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  pfVar1 = (typed_option->m_value).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pfVar1 == (float *)0x0) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = (double)*pfVar1;
  }
  std::ostream::_M_insert<double>(dVar3);
  return;
}

Assistant:

void serialize(typed_option<T>& typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }